

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

void __thiscall
fmt::v11::
print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&>
          (v11 *this,
          format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&>
          fmt,unsigned_short *args,unsigned_short *args_1,unsigned_short *args_2,
          unsigned_short *args_3,unsigned_short *args_4,unsigned_short *args_5)

{
  string_view fmt_00;
  unsigned_short *val;
  format_args local_118;
  value<fmt::v11::context> *local_f8 [2];
  value<fmt::v11::context> *local_e8;
  value<fmt::v11::context> *local_d8;
  value<fmt::v11::context> *local_c8;
  value<fmt::v11::context> *local_b8;
  value<fmt::v11::context> *local_a8;
  value<fmt::v11::context> **local_98;
  format_arg_store<fmt::v11::context,_6UL,_0UL,_2236962ULL> *vargs;
  unsigned_short *args_local_3;
  unsigned_short *args_local_2;
  unsigned_short *args_local_1;
  unsigned_short *args_local;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&>
  fmt_local;
  
  args_local_1 = (unsigned_short *)fmt.str_.size_;
  fmt_local.str_.data_ = fmt.str_.data_;
  fmt_local.str_.size_ = (size_t)args_4;
  val = args_1;
  vargs = (format_arg_store<fmt::v11::context,_6UL,_0UL,_2236962ULL> *)args_2;
  args_local_3 = args_1;
  args_local_2 = args;
  args_local = (unsigned_short *)this;
  local_f8[0] = detail::make_arg<true,_fmt::v11::context,_unsigned_short,_0>
                          ((value<fmt::v11::context> *)args_local_1,args_1);
  local_e8 = detail::make_arg<true,_fmt::v11::context,_unsigned_short,_0>
                       ((value<fmt::v11::context> *)args,val);
  local_d8 = detail::make_arg<true,_fmt::v11::context,_unsigned_short,_0>
                       ((value<fmt::v11::context> *)args_1,val);
  local_c8 = detail::make_arg<true,_fmt::v11::context,_unsigned_short,_0>
                       ((value<fmt::v11::context> *)args_2,val);
  local_b8 = detail::make_arg<true,_fmt::v11::context,_unsigned_short,_0>
                       ((value<fmt::v11::context> *)args_3,val);
  local_a8 = detail::make_arg<true,_fmt::v11::context,_unsigned_short,_0>
                       ((value<fmt::v11::context> *)fmt_local.str_.size_,val);
  local_98 = local_f8;
  local_118.desc_ = 0x222222;
  local_118.field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)local_98;
  fmt_00.size_ = (size_t)fmt_local.str_.data_;
  fmt_00.data_ = (char *)args_local;
  vprint(fmt_00,local_118);
  return;
}

Assistant:

FMT_INLINE void print(format_string<T...> fmt, T&&... args) {
  const auto& vargs = fmt::make_format_args(args...);
  if (!detail::use_utf8()) return detail::vprint_mojibake(stdout, fmt, vargs);
  return detail::is_locking<T...>() ? vprint_buffered(stdout, fmt, vargs)
                                    : vprint(fmt, vargs);
}